

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

bool __thiscall PStruct::ReadValue(PStruct *this,FArchive *ar,void *addr)

{
  byte local_29;
  void *pvStack_28;
  BYTE tag;
  void *addr_local;
  FArchive *ar_local;
  PStruct *this_local;
  
  pvStack_28 = addr;
  addr_local = ar;
  ar_local = (FArchive *)this;
  FArchive::operator<<(ar,&local_29);
  if (local_29 == 0xe) {
    this_local._7_1_ = ReadFields(this,(FArchive *)addr_local,pvStack_28);
  }
  else {
    PType::SkipValue((FArchive *)addr_local,(uint)local_29);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool PStruct::ReadValue(FArchive &ar, void *addr) const
{
	BYTE tag;
	ar << tag;
	if (tag == VAL_Struct)
	{
		return ReadFields(ar, addr);
	}
	SkipValue(ar, tag);
	return true;
}